

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O1

int cset_auto_compress(creation_set *cset,char *filename)

{
  undefined8 *puVar1;
  filter_set *pfVar2;
  int iVar3;
  char *pcVar4;
  char *suffix;
  char *pcVar5;
  size_t sVar6;
  filter_set *pfVar7;
  filter_set *pfVar8;
  size_t sVar9;
  
  pcVar4 = strdup(filename);
  if (pcVar4 != (char *)0x0) {
    pfVar7 = cset->filters;
    iVar3 = cset->filter_count;
    cset->filters = (filter_set *)0x0;
    cset->filter_count = 0;
    suffix = strrchr(pcVar4,0x2e);
    while (suffix != (char *)0x0) {
      while (pcVar5 = get_suffix_code((suffix_code_t *)get_filter_code_filters,suffix),
            pcVar5 != (char *)0x0) {
        _cset_add_filter(cset,0,pcVar5);
        *suffix = '\0';
        suffix = strrchr(pcVar4,0x2e);
        if (suffix == (char *)0x0) goto LAB_0010d109;
      }
      pcVar5 = get_suffix_code((suffix_code_t *)get_format_code_formats,suffix);
      if (pcVar5 != (char *)0x0) {
        cset_set_format(cset,pcVar5);
        break;
      }
      pcVar5 = get_suffix_code((suffix_code_t *)decompose_alias_alias,suffix);
      if (pcVar5 == (char *)0x0) break;
      *suffix = '\0';
      sVar9 = strlen(pcVar4);
      sVar6 = strlen(pcVar5);
      pcVar4 = (char *)realloc(pcVar4,sVar6 + sVar9 + 1);
      if (pcVar4 == (char *)0x0) goto LAB_0010d18b;
      strcat(pcVar4,pcVar5);
      suffix = strrchr(pcVar4,0x2e);
    }
LAB_0010d109:
    free(pcVar4);
    if (cset->filters == (filter_set *)0x0) {
      cset->filters = pfVar7;
      cset->filter_count = iVar3;
      iVar3 = 0;
    }
    else {
      _cleanup_filters(pfVar7,iVar3);
      iVar3 = cset->filter_count;
      sVar9 = (long)iVar3 << 4;
      pfVar7 = (filter_set *)malloc(sVar9);
      if (pfVar7 == (filter_set *)0x0) goto LAB_0010d18b;
      if (0 < iVar3) {
        pfVar2 = cset->filters;
        pfVar8 = pfVar7;
        do {
          puVar1 = (undefined8 *)((long)&pfVar2[-1].program + sVar9);
          pcVar4 = (char *)puVar1[1];
          *(undefined8 *)pfVar8 = *puVar1;
          pfVar8->filter_name = pcVar4;
          pfVar8 = pfVar8 + 1;
          sVar9 = sVar9 - 0x10;
        } while (sVar9 != 0);
      }
      free(cset->filters);
      cset->filters = pfVar7;
      iVar3 = 1;
    }
    return iVar3;
  }
LAB_0010d18b:
  lafe_errc(1,0,"No memory");
}

Assistant:

int
cset_auto_compress(struct creation_set *cset, const char *filename)
{
	struct filter_set *old_filters;
	char *name, *p;
	const char *code;
	int old_filter_count;

	name = strdup(filename);
	if (name == NULL)
		lafe_errc(1, 0, "No memory");
	/* Save previous filters. */
	old_filters = cset->filters;
	old_filter_count = cset->filter_count;
	cset->filters = NULL;
	cset->filter_count = 0;

	for (;;) {
		/* Get the suffix. */
		p = strrchr(name, '.');
		if (p == NULL)
			break;
		/* Suppose it indicates compression/filter type
		 * such as ".gz". */
		code = get_filter_code(p);
		if (code != NULL) {
			cset_add_filter(cset, code);
			*p = '\0';
			continue;
		}
		/* Suppose it indicates format type such as ".tar". */
		code = get_format_code(p);
		if (code != NULL) {
			cset_set_format(cset, code);
			break;
		}
		/* Suppose it indicates alias such as ".tgz". */
		code = decompose_alias(p);
		if (code == NULL)
			break;
		/* Replace the suffix. */
		*p = '\0';
		name = realloc(name, strlen(name) + strlen(code) + 1);
		if (name == NULL)
			lafe_errc(1, 0, "No memory");
		strcat(name, code);
	}
	free(name);
	if (cset->filters) {
		struct filter_set *v;
		int i, r;

		/* Release previous filters. */
		_cleanup_filters(old_filters, old_filter_count);

		v = malloc(sizeof(*v) * cset->filter_count);
		if (v == NULL)
			lafe_errc(1, 0, "No memory");
		/* Reverse filter sequence. */
		for (i = 0, r = cset->filter_count; r > 0; )
			v[i++] = cset->filters[--r];
		free(cset->filters);
		cset->filters = v;
		return (1);
	} else {
		/* Put previous filters back. */
		cset->filters = old_filters;
		cset->filter_count = old_filter_count;
		return (0);
	}
}